

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructOrUnionDeclaration_Struct.cpp
# Opt level: O2

ostream * psy::C::operator<<(ostream *os,StructDeclarationSymbol *strukt)

{
  ScopeKind K;
  ostream *poVar1;
  TagType *tagTy;
  Scope *this;
  FieldDeclarationSymbol **fld;
  pointer ppFVar2;
  _Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  local_38;
  
  if (strukt != (StructDeclarationSymbol *)0x0) {
    std::operator<<(os,"<Struct |");
    poVar1 = std::operator<<(os," type:");
    tagTy = TagDeclarationSymbol::introducedNewType((TagDeclarationSymbol *)strukt);
    operator<<(poVar1,tagTy);
    poVar1 = std::operator<<(os," scope:");
    this = DeclarationSymbol::enclosingScope((DeclarationSymbol *)strukt);
    K = Scope::kind(this);
    operator<<(poVar1,K);
    StructOrUnionDeclarationSymbol::fields
              ((Fields *)&local_38,&strukt->super_StructOrUnionDeclarationSymbol);
    for (ppFVar2 = local_38._M_impl.super__Vector_impl_data._M_start;
        ppFVar2 != local_38._M_impl.super__Vector_impl_data._M_finish; ppFVar2 = ppFVar2 + 1) {
      poVar1 = std::operator<<(os," field:");
      operator<<(poVar1,*ppFVar2);
    }
    std::
    _Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
    ::~_Vector_base(&local_38);
    std::operator<<(os,">");
    return os;
  }
  poVar1 = std::operator<<(os,"<Struct is null>");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const StructDeclarationSymbol* strukt)
{
    if (!strukt)
        return os << "<Struct is null>";
    os << "<Struct |";
    os << " type:" << strukt->introducedNewType();
    os << " scope:" << strukt->enclosingScope()->kind();
    for (const auto& fld : strukt->fields())
        os << " field:" << fld;
    os << ">";
    return os;
}